

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

void __thiscall
QPropertyDelayedNotifications::notify(QPropertyDelayedNotifications *this,qsizetype index)

{
  ulong uVar1;
  long in_FS_OFFSET;
  QPropertyObserverPointer local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->delayedProperties[index].d_ptr;
  if ((uVar1 & 1) == 0) {
    if (this->delayedProperties[index].originalBindingData != (QPropertyBindingData *)0x0) {
      this->delayedProperties[index].originalBindingData = (QPropertyBindingData *)0x0;
      local_10.ptr = (QPropertyObserver *)(uVar1 & 0xfffffffffffffffc);
      this->delayedProperties[index].d_ptr = 0;
      if ((uVar1 & 0xfffffffffffffffc) != 0) {
        QPropertyObserverPointer::notify(&local_10,this->delayedProperties[index].propertyData);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void notify(qsizetype index) {
        auto *delayed = delayedProperties + index;
        if (delayed->d_ptr  & QPropertyBindingData::BindingBit)
            return; // already handled
        if (!delayed->originalBindingData)
            return;
        delayed->originalBindingData = nullptr;

        QPropertyObserverPointer observer  { reinterpret_cast<QPropertyObserver *>(delayed->d_ptr & ~QPropertyBindingData::DelayedNotificationBit) };
        delayed->d_ptr = 0;

        if (observer)
            observer.notify(delayed->propertyData);
    }